

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

int allphone_search_start(ps_search_t *search)

{
  bin_mdef_t *pbVar1;
  int iVar2;
  short sVar3;
  uint uVar4;
  char *fmt;
  long ln;
  hmm_t *phVar5;
  
  pbVar1 = search->acmod->mdef;
  iVar2 = pbVar1->n_ciphone;
  if (0 < iVar2) {
    uVar4 = 0;
    sVar3 = 0;
    do {
      phVar5 = (hmm_t *)(&(search[1].pls)->vt)[uVar4];
      if (phVar5 != (hmm_t *)0x0) {
        do {
          hmm_clear(phVar5);
          phVar5 = *(hmm_t **)(phVar5[1].score + 4);
        } while (phVar5 != (hmm_t *)0x0);
        iVar2 = pbVar1->n_ciphone;
      }
      sVar3 = sVar3 + 1;
      uVar4 = (uint)sVar3;
    } while ((int)uVar4 < iVar2);
  }
  *(undefined8 *)((long)&search[1].hyp_str + 4) = 0;
  blkarray_list_reset((blkarray_list_t *)search[1].last_link);
  *(undefined4 *)&search[1].d2p = 0;
  sVar3 = (short)pbVar1->sil;
  if (sVar3 < 0) {
    fmt = "Cannot find CI-phone %s\n";
    ln = 0x2b9;
  }
  else {
    for (phVar5 = (hmm_t *)(&(search[1].pls)->vt)[sVar3]; phVar5 != (hmm_t *)0x0;
        phVar5 = *(hmm_t **)(phVar5[1].score + 4)) {
      if (*(int *)&phVar5[1].ctx == (int)sVar3) {
        hmm_enter(phVar5,0,0,0);
        ptmr_reset((ptmr_t *)&search[1].start_wid);
        ptmr_start((ptmr_t *)&search[1].start_wid);
        return 0;
      }
    }
    fmt = "Cannot find HMM for %s\n";
    ln = 700;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,ln,fmt,"SIL");
  exit(1);
}

Assistant:

int
allphone_search_start(ps_search_t * search)
{
    allphone_search_t *allphs;
    bin_mdef_t *mdef;
    s3cipid_t ci;
    phmm_t *p;

    allphs = (allphone_search_t *) search;
    mdef = search->acmod->mdef;

    /* Reset all HMMs. */
    for (ci = 0; ci < bin_mdef_n_ciphone(mdef); ci++) {
        for (p = allphs->ci_phmm[(unsigned) ci]; p; p = p->next) {
            hmm_clear(&(p->hmm));
        }
    }

    allphs->n_hmm_eval = 0;
    allphs->n_sen_eval = 0;

    /* Free history nodes, if any */
    blkarray_list_reset(allphs->history);

    /* Initialize start state of the SILENCE PHMM */
    allphs->frame = 0;
    ci = bin_mdef_silphone(mdef);
    if (NOT_S3CIPID(ci))
        E_FATAL("Cannot find CI-phone %s\n", S3_SILENCE_CIPHONE);
    for (p = allphs->ci_phmm[ci]; p && (p->pid != ci); p = p->next);
    if (!p)
        E_FATAL("Cannot find HMM for %s\n", S3_SILENCE_CIPHONE);
    hmm_enter(&(p->hmm), 0, 0, allphs->frame);

    ptmr_reset(&allphs->perf);
    ptmr_start(&allphs->perf);

    return 0;
}